

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O2

bool spvParseTargetEnv(char *s,spv_target_env_conflict *env)

{
  char *__s;
  int iVar1;
  spv_target_env_conflict sVar2;
  size_t __n;
  long lVar3;
  
  lVar3 = 8;
  do {
    if (lVar3 == 0x1a8) {
      sVar2 = EBadProfile;
      if (env != (spv_target_env_conflict *)0x0) {
LAB_00544f69:
        *env = sVar2;
      }
LAB_00544f6b:
      return lVar3 != 0x1a8;
    }
    if (s != (char *)0x0) {
      __s = *(char **)((long)pygen_variable_CLDEBUG100_DebugOperationEntries[9].operandTypes +
                      lVar3 + 0x40);
      __n = strlen(__s);
      iVar1 = strncmp(s,__s,__n);
      if (iVar1 == 0) {
        if (env == (spv_target_env_conflict *)0x0) goto LAB_00544f6b;
        sVar2 = *(spv_target_env_conflict *)((long)&spvTargetEnvNameMap[0].first + lVar3);
        goto LAB_00544f69;
      }
    }
    lVar3 = lVar3 + 0x10;
  } while( true );
}

Assistant:

bool spvParseTargetEnv(const char* s, spv_target_env* env) {
  auto match = [s](const char* b) {
    return s && (0 == strncmp(s, b, strlen(b)));
  };
  for (auto& name_env : spvTargetEnvNameMap) {
    if (match(name_env.first)) {
      if (env) {
        *env = name_env.second;
      }
      return true;
    }
  }
  if (env) *env = SPV_ENV_UNIVERSAL_1_0;
  return false;
}